

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getcold.c
# Opt level: O0

int ffgpfd(fitsfile *fptr,long group,LONGLONG firstelem,LONGLONG nelem,double *array,char *nularray,
          int *anynul,int *status)

{
  int iVar1;
  int *in_stack_00000010;
  int nullcheck;
  long row;
  void *in_stack_00000100;
  int in_stack_0000010c;
  LONGLONG in_stack_00000110;
  LONGLONG in_stack_00000118;
  int in_stack_00000124;
  fitsfile *in_stack_00000128;
  void *in_stack_00000170;
  char *in_stack_00000178;
  int *in_stack_00000180;
  int *in_stack_00000188;
  double in_stack_00007248;
  long in_stack_00007250;
  LONGLONG in_stack_00007258;
  LONGLONG in_stack_00007260;
  LONGLONG in_stack_00007268;
  int in_stack_00007274;
  fitsfile *in_stack_00007278;
  int in_stack_000072c0;
  double *in_stack_000072c8;
  char *in_stack_000072d0;
  int *in_stack_000072d8;
  int *in_stack_000072e0;
  fitsfile *in_stack_ffffffffffffff78;
  int local_c;
  
  iVar1 = fits_is_compressed_image(in_stack_ffffffffffffff78,(int *)0x17f040);
  if (iVar1 == 0) {
    ffgcld(in_stack_00007278,in_stack_00007274,in_stack_00007268,in_stack_00007260,in_stack_00007258
           ,in_stack_00007250,in_stack_000072c0,in_stack_00007248,in_stack_000072c8,
           in_stack_000072d0,in_stack_000072d8,in_stack_000072e0);
    local_c = *in_stack_00000010;
  }
  else {
    fits_read_compressed_pixels
              (in_stack_00000128,in_stack_00000124,in_stack_00000118,in_stack_00000110,
               in_stack_0000010c,in_stack_00000100,in_stack_00000170,in_stack_00000178,
               in_stack_00000180,in_stack_00000188);
    local_c = *in_stack_00000010;
  }
  return local_c;
}

Assistant:

int ffgpfd( fitsfile *fptr,   /* I - FITS file pointer                       */
            long  group,      /* I - group to read (1 = 1st group)           */
            LONGLONG  firstelem,  /* I - first vector element to read (1 = 1st)  */
            LONGLONG  nelem,      /* I - number of values to read                */
            double *array,    /* O - array of values that are returned       */
            char *nularray,   /* O - array of null pixel flags               */
            int  *anynul,     /* O - set to 1 if any values are null; else 0 */
            int  *status)     /* IO - error status                           */
/*
  Read an array of values from the primary array. Data conversion
  and scaling will be performed if necessary (e.g, if the datatype of
  the FITS array is not the same as the array being read).
  Any undefined pixels in the returned array will be set = 0 and the 
  corresponding nularray value will be set = 1.
  ANYNUL is returned with a value of .true. if any pixels are undefined.
*/
{
    long row;
    int nullcheck = 2;

    if (fits_is_compressed_image(fptr, status))
    {
        /* this is a compressed image in a binary table */

        fits_read_compressed_pixels(fptr, TDOUBLE, firstelem, nelem,
            nullcheck, NULL, array, nularray, anynul, status);
        return(*status);
    }

    /*
      the primary array is represented as a binary table:
      each group of the primary array is a row in the table,
      where the first column contains the group parameters
      and the second column contains the image itself.
    */

    row=maxvalue(1,group);

    ffgcld(fptr, 2, row, firstelem, nelem, 1, 2, 0.,
               array, nularray, anynul, status);
    return(*status);
}